

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

void __thiscall QAbstractSpinBox::contextMenuEvent(QAbstractSpinBox *this,QContextMenuEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  long lVar1;
  QWidget *this_01;
  int *piVar2;
  QAction *this_02;
  QAction *pQVar3;
  QAction *pQVar4;
  int *piVar5;
  QPoint QVar6;
  QAction *pQVar7;
  long lVar8;
  int iVar9;
  QWidget *pQVar10;
  undefined8 uVar11;
  QWidget *pQVar12;
  long in_FS_OFFSET;
  QPoint local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  this_01 = &QLineEdit::createStandardContextMenu(this_00->edit)->super_QWidget;
  if (this_01 == (QWidget *)0x0) goto LAB_0047a773;
  piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&this_01->super_QObject);
  if (piVar2 == (int *)0x0) goto LAB_0047a773;
  if (piVar2[1] != 0) {
    QAbstractSpinBoxPrivate::reset(this_00);
    this_02 = (QAction *)operator_new(0x10);
    QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,0x6dd595);
    pQVar10 = (QWidget *)0x0;
    if (piVar2[1] != 0) {
      pQVar10 = this_01;
    }
    QAction::QAction(this_02,(QString *)&local_50,&pQVar10->super_QObject);
    if ((QPoint)local_50.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_50.d.d = *(int *)local_50.d.d + -1;
      UNLOCK();
      if (*(int *)local_50.d.d == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    QKeySequence::QKeySequence((QKeySequence *)&local_50,SelectAll);
    QAction::setShortcut((QKeySequence *)this_02);
    QKeySequence::~QKeySequence((QKeySequence *)&local_50);
    pQVar10 = (QWidget *)0x0;
    pQVar12 = this_01;
    if (piVar2[1] == 0) {
      pQVar12 = pQVar10;
    }
    lVar8 = *(long *)&(this_00->edit->super_QWidget).field_0x8;
    lVar1 = *(long *)(lVar8 + 0x260);
    if (lVar1 != 0) {
      if (*(int *)(lVar1 + 4) == 0) {
        pQVar10 = (QWidget *)0x0;
      }
      else {
        pQVar10 = *(QWidget **)(lVar8 + 0x268);
      }
    }
    QWidget::insertAction(pQVar12,(QAction *)pQVar10,this_02);
    pQVar10 = (QWidget *)0x0;
    pQVar12 = this_01;
    if (piVar2[1] == 0) {
      pQVar12 = pQVar10;
    }
    lVar8 = *(long *)&(this_00->edit->super_QWidget).field_0x8;
    lVar1 = *(long *)(lVar8 + 0x260);
    if (lVar1 != 0) {
      if (*(int *)(lVar1 + 4) == 0) {
        pQVar10 = (QWidget *)0x0;
      }
      else {
        pQVar10 = *(QWidget **)(lVar8 + 0x268);
      }
    }
    QWidget::removeAction(pQVar12,(QAction *)pQVar10);
    QMenu::addSeparator((QMenu *)this_01);
    (**(code **)(*(long *)this + 0x1c8))(this);
    pQVar10 = this_01;
    if (piVar2[1] == 0) {
      pQVar10 = (QWidget *)0x0;
    }
    QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,0x6dd5a1);
    pQVar3 = QWidget::addAction(pQVar10,&local_50);
    if ((QPoint)local_50.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_50.d.d = *(int *)local_50.d.d + -1;
      UNLOCK();
      if (*(int *)local_50.d.d == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    QAction::setEnabled(SUB81(pQVar3,0));
    pQVar10 = this_01;
    if (piVar2[1] == 0) {
      pQVar10 = (QWidget *)0x0;
    }
    QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,0x6dd5aa);
    pQVar4 = QWidget::addAction(pQVar10,&local_50);
    if ((QPoint)local_50.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_50.d.d = *(int *)local_50.d.d + -1;
      UNLOCK();
      if (*(int *)local_50.d.d == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    QAction::setEnabled(SUB81(pQVar4,0));
    QMenu::addSeparator((QMenu *)this_01);
    piVar5 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
    if (event[0x38] == (QContextMenuEvent)0x0) {
      local_50.d.d = *(Data **)(event + 0x30);
    }
    else {
      local_58.xp.m_i = *(int *)(event + 0x28);
      local_58.yp.m_i = 0;
      QVar6 = QWidget::mapToGlobal((QWidget *)this,&local_58);
      lVar8 = *(long *)(this + 0x20);
      iVar9 = *(int *)(lVar8 + 0x1c) - *(int *)(lVar8 + 0x14);
      local_50.d.d._0_4_ = ((iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1) + QVar6.xp.m_i.m_i;
      iVar9 = *(int *)(lVar8 + 0x20) - *(int *)(lVar8 + 0x18);
      local_50.d.d._4_4_ = ((iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1) + QVar6.yp.m_i.m_i;
    }
    pQVar7 = QMenu::exec((QMenu *)this_01,(QPoint *)&local_50,(QAction *)0x0);
    if (piVar2[1] != 0) {
      (**(code **)(*(long *)this_01 + 0x20))(this_01);
    }
    if (piVar5 == (int *)0x0) {
      event[0xc] = (QContextMenuEvent)0x1;
    }
    else {
      if ((piVar5[1] != 0) && (pQVar7 != (QAction *)0x0)) {
        if (pQVar7 == pQVar3) {
          lVar8 = *(long *)this;
          uVar11 = 1;
        }
        else {
          if (pQVar7 != pQVar4) {
            if (pQVar7 == this_02) {
              selectAll(this);
            }
            goto LAB_0047a753;
          }
          lVar8 = *(long *)this;
          uVar11 = 0xffffffff;
        }
        (**(code **)(lVar8 + 0x1b0))(this,uVar11);
      }
LAB_0047a753:
      event[0xc] = (QContextMenuEvent)0x1;
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        operator_delete(piVar5);
      }
    }
  }
  LOCK();
  *piVar2 = *piVar2 + -1;
  UNLOCK();
  if (*piVar2 == 0) {
    operator_delete(piVar2);
  }
LAB_0047a773:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::contextMenuEvent(QContextMenuEvent *event)
{
#ifdef Q_OS_WASM
    if (!qstdweb::haveAsyncify()) {
        qDebug() << " Skipping context menu for spinbox since asyncify is off";
        return;
    }
#endif
    Q_D(QAbstractSpinBox);

    QPointer<QMenu> menu = d->edit->createStandardContextMenu();
    if (!menu)
        return;

    d->reset();

    QAction *selAll = new QAction(tr("&Select All"), menu);
#if QT_CONFIG(shortcut)
    selAll->setShortcut(QKeySequence::SelectAll);
#endif
    menu->insertAction(d->edit->d_func()->selectAllAction,
                      selAll);
    menu->removeAction(d->edit->d_func()->selectAllAction);
    menu->addSeparator();
    const uint se = stepEnabled();
    QAction *up = menu->addAction(tr("&Step up"));
    up->setEnabled(se & StepUpEnabled);
    QAction *down = menu->addAction(tr("Step &down"));
    down->setEnabled(se & StepDownEnabled);
    menu->addSeparator();

    const QPointer<QAbstractSpinBox> that = this;
    const QPoint pos = (event->reason() == QContextMenuEvent::Mouse)
        ? event->globalPos() : mapToGlobal(QPoint(event->pos().x(), 0)) + QPoint(width() / 2, height() / 2);
    const QAction *action = menu->exec(pos);
    delete static_cast<QMenu *>(menu);
    if (that && action) {
        if (action == up) {
            stepBy(1);
        } else if (action == down) {
            stepBy(-1);
        } else if (action == selAll) {
            selectAll();
        }
    }
    event->accept();
}